

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

CommandLineOption ** __thiscall
List<CommandLineOption_*>::find
          (List<CommandLineOption_*> *this,function<bool_(CommandLineOption_*const_&)> *func)

{
  function<bool_(CommandLineOption_*const_&)> *pfVar1;
  bool bVar2;
  CommandLineOption **extraout_RAX;
  CommandLineOption **ppCVar3;
  function<bool_(CommandLineOption_*const_&)> *pfVar4;
  function<bool_(CommandLineOption_*const_&)> *raw_args;
  _Map_pointer pppCVar5;
  function<bool_(CommandLineOption_*const_&)> *pfVar6;
  allocator aStack_89;
  String SStack_88;
  CommandLineOption **appCStack_68 [2];
  CommandLineOption *apCStack_58 [2];
  function<bool_(CommandLineOption_*const_&)> *pfStack_48;
  code *pcStack_40;
  
  pfVar6 = (function<bool_(CommandLineOption_*const_&)> *)
           (this->_deque).
           super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pfVar1 = (function<bool_(CommandLineOption_*const_&)> *)
           (this->_deque).
           super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pfVar6 != pfVar1) {
    pfVar4 = (function<bool_(CommandLineOption_*const_&)> *)
             (this->_deque).
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pppCVar5 = (this->_deque).
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    raw_args = func;
    do {
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        pcStack_40 = error<char>;
        std::__throw_bad_function_call();
        pfStack_48 = func;
        std::__cxx11::string::string((string *)appCStack_68,(char *)this,&aStack_89);
        format<char>(&SStack_88,(String *)appCStack_68,(char *)raw_args);
        error(&SStack_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SStack_88._string._M_dataplus._M_p != &SStack_88._string.field_2) {
          operator_delete(SStack_88._string._M_dataplus._M_p);
        }
        ppCVar3 = apCStack_58;
        if (appCStack_68[0] != ppCVar3) {
          operator_delete(appCStack_68[0]);
          ppCVar3 = extraout_RAX;
        }
        return ppCVar3;
      }
      pcStack_40 = (code *)0x1118d9;
      raw_args = pfVar6;
      this = (List<CommandLineOption_*> *)func;
      bVar2 = (*func->_M_invoker)((_Any_data *)func,(CommandLineOption **)pfVar6);
      if (bVar2) {
        return (CommandLineOption **)pfVar6;
      }
      pfVar6 = (function<bool_(CommandLineOption_*const_&)> *)
               ((long)&(pfVar6->super__Function_base)._M_functor + 8);
      if (pfVar6 == pfVar4) {
        pfVar6 = (function<bool_(CommandLineOption_*const_&)> *)pppCVar5[1];
        pppCVar5 = pppCVar5 + 1;
        pfVar4 = pfVar6 + 0x10;
      }
    } while (pfVar6 != pfVar1);
  }
  return (CommandLineOption **)0x0;
}

Assistant:

void List<T>::removeAt (int pos)
{
	ASSERT_LT (pos, size());
	_deque.erase (_deque.begin() + pos);
}